

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Wings> __thiscall
cinject::InstanceStorage<Wings,_cinject::ConstructorFactory<Wings,_void>_>::createInstance
          (InstanceStorage<Wings,_cinject::ConstructorFactory<Wings,_void>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  undefined8 *puVar2;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Wings> sVar3;
  ContextGuard guard;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  ContextGuard local_48;
  
  pcVar1 = context[1].componentStack_.
           super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_90 = local_80;
  if (pcVar1 == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"5Wings","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,context[1].container_,
               (long)&(context[1].container_)->parentContainer_ + (long)pcVar1);
  }
  local_70 = (undefined1  [8])&Wings::typeinfo;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_90,local_90 + local_88);
  ContextGuard::ContextGuard(&local_48,in_RDX,(component_type *)local_70);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  ContextGuard::ensureNoCycle(&local_48);
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_001479d8;
  *(undefined8 **)&this->field_0x8 = puVar2;
  this->_vptr_InstanceStorage = (_func_int **)(puVar2 + 2);
  ContextGuard::~ContextGuard(&local_48);
  sVar3.super___shared_ptr<Wings,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar3.super___shared_ptr<Wings,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Wings>)sVar3.super___shared_ptr<Wings,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }